

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_3,_3>,_tcu::Matrix<double,_3,_3>_>::call
          (unary<tcu::Matrix<double,_3,_3>,_tcu::Matrix<double,_3,_3>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  Matrix<double,_3,_3> local_110;
  code *local_c8;
  functionPointer p_function;
  undefined1 local_b0 [8];
  Matrix<double,_3,_3> arg;
  Matrix<double,_3,_3> result;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  unary<tcu::Matrix<double,_3,_3>,_tcu::Matrix<double,_3,_3>_> *this_local;
  
  tcu::Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)(arg.m_data.m_data[2].m_data + 2));
  tcu::Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)local_b0);
  unpack<tcu::Matrix<double,_3,_3>_>::get(argument_src,(Matrix<double,_3,_3> *)local_b0);
  local_c8 = (code *)(this->super_unaryBase).super_functionObject.m_p_function;
  (*local_c8)(&local_110,local_b0);
  tcu::Matrix<double,_3,_3>::operator=
            ((Matrix<double,_3,_3> *)(arg.m_data.m_data[2].m_data + 2),&local_110);
  tcu::Matrix<double,_3,_3>::~Matrix(&local_110);
  pack<tcu::Matrix<double,_3,_3>_>::set
            (result_dst,(Matrix<double,_3,_3> *)(arg.m_data.m_data[2].m_data + 2));
  tcu::Matrix<double,_3,_3>::~Matrix((Matrix<double,_3,_3> *)local_b0);
  tcu::Matrix<double,_3,_3>::~Matrix((Matrix<double,_3,_3> *)(arg.m_data.m_data[2].m_data + 2));
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}